

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

vectorTy * __thiscall DataRefs::GetSimWind(DataRefs *this,double alt_m)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pWVar7;
  __normal_iterator<const_DataRefs::WindLayerTy_*,_std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>_>
  in_RSI;
  anon_class_8_1_a7a3ae77_for__M_pred in_RDI;
  double in_XMM0_Qa;
  double dVar8;
  double dVar9;
  double hdg;
  double hdg_diff;
  double spd;
  double f;
  WindLayerTy *hgh;
  WindLayerTy *low;
  __normal_iterator<const_DataRefs::WindLayerTy_*,_std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>_>
  iter;
  __normal_iterator<const_DataRefs::WindLayerTy_*,_std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>_>
  in_stack_ffffffffffffff48;
  vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_> *in_stack_ffffffffffffff50;
  vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_> *this_00;
  vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_> *in_stack_ffffffffffffff60;
  __normal_iterator<const_DataRefs::WindLayerTy_*,_std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>_>
  __last;
  __normal_iterator<const_DataRefs::WindLayerTy_*,_std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>_>
  local_50;
  reference local_48;
  WindLayerTy *local_40;
  WindLayerTy *local_38;
  double local_30;
  WindLayerTy *local_28;
  WindLayerTy *local_20;
  __normal_iterator<const_DataRefs::WindLayerTy_*,_std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>_>
  local_18;
  double local_10;
  
  __last._M_current = (WindLayerTy *)in_RDI.alt_m;
  local_10 = in_XMM0_Qa;
  bVar3 = std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::empty
                    (in_stack_ffffffffffffff60);
  if (bVar3) {
    vectorTy::vectorTy((vectorTy *)in_RDI.alt_m,0.0,NAN,NAN,0.0);
  }
  else {
    sVar5 = std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::size
                      ((vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_> *)
                       &in_RSI._M_current[0x89].dir_degt);
    if (((sVar5 != 1) && (uVar4 = std::isnan(local_10), (uVar4 & 1) == 0)) &&
       (dVar9 = local_10,
       pvVar6 = std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::
                operator[]((vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_> *)
                           &in_RSI._M_current[0x89].dir_degt,0), pvVar6->alt_m < dVar9)) {
      local_20 = (WindLayerTy *)
                 std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::cbegin
                           (in_stack_ffffffffffffff48._M_current);
      local_28 = (WindLayerTy *)
                 std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::cend
                           (in_stack_ffffffffffffff48._M_current);
      local_30 = local_10;
      local_18 = std::
                 find_if<__gnu_cxx::__normal_iterator<DataRefs::WindLayerTy_const*,std::vector<DataRefs::WindLayerTy,std::allocator<DataRefs::WindLayerTy>>>,DataRefs::GetSimWind(double)const::__0>
                           (in_RSI,__last,in_RDI);
      local_38 = (WindLayerTy *)
                 std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::cend
                           (in_stack_ffffffffffffff48._M_current);
      bVar3 = __gnu_cxx::operator==
                        ((__normal_iterator<const_DataRefs::WindLayerTy_*,_std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>_>
                          *)in_stack_ffffffffffffff50,
                         (__normal_iterator<const_DataRefs::WindLayerTy_*,_std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>_>
                          *)in_stack_ffffffffffffff48._M_current);
      if (bVar3) {
        pvVar6 = std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::back
                           (in_stack_ffffffffffffff50);
        this_00 = (vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_> *)
                  pvVar6->dir_degt;
        pvVar6 = std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::back
                           (this_00);
        vectorTy::vectorTy((vectorTy *)in_RDI.alt_m,(double)this_00,NAN,NAN,pvVar6->spd_msc);
        return (vectorTy *)__last._M_current;
      }
      local_40 = (WindLayerTy *)
                 std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::cbegin
                           (in_stack_ffffffffffffff48._M_current);
      bVar3 = __gnu_cxx::operator==
                        ((__normal_iterator<const_DataRefs::WindLayerTy_*,_std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>_>
                          *)in_stack_ffffffffffffff50,
                         (__normal_iterator<const_DataRefs::WindLayerTy_*,_std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>_>
                          *)in_stack_ffffffffffffff48._M_current);
      if (!bVar3) {
        local_50 = std::
                   prev<__gnu_cxx::__normal_iterator<DataRefs::WindLayerTy_const*,std::vector<DataRefs::WindLayerTy,std::allocator<DataRefs::WindLayerTy>>>>
                             (in_stack_ffffffffffffff48,0x14008a);
        local_48 = __gnu_cxx::
                   __normal_iterator<const_DataRefs::WindLayerTy_*,_std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>_>
                   ::operator*(&local_50);
        pWVar7 = __gnu_cxx::
                 __normal_iterator<const_DataRefs::WindLayerTy_*,_std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>_>
                 ::operator*(&local_18);
        dVar8 = (local_10 - local_48->alt_m) / (pWVar7->alt_m - local_48->alt_m);
        dVar1 = local_48->spd_msc;
        dVar2 = pWVar7->spd_msc;
        dVar9 = HeadingDiff(in_RDI.alt_m,dVar9);
        dVar9 = HeadingNormalize(dVar8 * dVar9 + local_48->dir_degt);
        vectorTy::vectorTy((vectorTy *)in_RDI.alt_m,dVar9,NAN,NAN,
                           (1.0 - dVar8) * dVar1 + dVar8 * dVar2);
        return (vectorTy *)__last._M_current;
      }
      pvVar6 = std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::front
                         (in_stack_ffffffffffffff50);
      dVar9 = pvVar6->dir_degt;
      pvVar6 = std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::front
                         (in_stack_ffffffffffffff50);
      vectorTy::vectorTy((vectorTy *)in_RDI.alt_m,dVar9,NAN,NAN,pvVar6->spd_msc);
      return (vectorTy *)__last._M_current;
    }
    pvVar6 = std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::front
                       (in_stack_ffffffffffffff50);
    dVar9 = pvVar6->dir_degt;
    pvVar6 = std::vector<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>::front
                       (in_stack_ffffffffffffff50);
    vectorTy::vectorTy((vectorTy *)in_RDI.alt_m,dVar9,NAN,NAN,pvVar6->spd_msc);
  }
  return (vectorTy *)__last._M_current;
}

Assistant:

const vectorTy DataRefs::GetSimWind (double alt_m) const
{
    // No wind layers known? -> return "no wind"
    if (lastWind.empty())
        return vectorTy(0.0, NAN, NAN, 0.0);
    // Just one wind layer? Or plane is lower than first layer? -> return first layer's wind
    if (lastWind.size() == 1 || std::isnan(alt_m) || alt_m <= lastWind[0].alt_m)
        return vectorTy(lastWind.front().dir_degt, NAN, NAN, lastWind.front().spd_msc);
    // More than one layer and plane is flying higher than first layer
    // Find the fist layer, which is higher than the plane
    auto iter = std::find_if(lastWind.cbegin(), lastWind.cend(),
                             [alt_m](const WindLayerTy& wl){ return alt_m <= wl.alt_m; });
    // If not found, then plane is flying higher than highest layer -> return highest wind
    if (iter == lastWind.cend())
        return vectorTy(lastWind.back().dir_degt, NAN, NAN, lastWind.back().spd_msc);
    // else we found a higher wind layer, but is it right away the first?
    // (should not happen...but just to be on the safe side we catch the case)
    if (iter == lastWind.cbegin())
        return vectorTy(lastWind.front().dir_degt, NAN, NAN, lastWind.front().spd_msc);
    // Now really...plane is in the middle between two layers
    // return an average value between them
    const WindLayerTy& low = *std::prev(iter);
    const WindLayerTy& hgh = *iter;
    const double f = (alt_m - low.alt_m) / (hgh.alt_m - low.alt_m);     // factor how much to use the higher value, should be between 0 and 1
    const double spd = (1.0-f) * low.spd_msc + f * hgh.spd_msc;         // average of speed
    const double hdg_diff = HeadingDiff(low.dir_degt, hgh.dir_degt);    // heading diff
    const double hdg = low.dir_degt + f*hdg_diff;                       // "average" of heading
    return vectorTy(HeadingNormalize(hdg), NAN, NAN, spd);
}